

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player.cpp
# Opt level: O3

void __thiscall minibag::Player::advertise(Player *this,ConnectionInfo *c)

{
  PublisherMap *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  const_iterator __pos;
  undefined1 *puVar2;
  iterator iVar3;
  iterator iVar4;
  Publisher pub;
  string callerid_topic;
  string callerid;
  AdvertiseOptions opts;
  undefined1 auStack_188 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
  local_138;
  AdvertiseOptions local_108;
  
  this_01 = &((c->header).
              super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->_M_t;
  paVar1 = &local_108.topic.field_2;
  local_108.topic._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"callerid","");
  iVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(this_01,&local_108.topic);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108.topic._M_dataplus._M_p != paVar1) {
    operator_delete(local_108.topic._M_dataplus._M_p,
                    local_108.topic.field_2._M_allocated_capacity + 1);
  }
  puVar2 = auStack_188 + 0x40;
  local_158._M_dataplus._M_p = puVar2;
  if ((_Rb_tree_header *)iVar3._M_node ==
      &(((c->header).
         super___shared_ptr<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->_M_t)._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::_M_construct<char_const*>((string *)(auStack_188 + 0x30),"");
  }
  else {
    std::__cxx11::string::_M_construct<char*>
              ((string *)(auStack_188 + 0x30),*(long *)(iVar3._M_node + 2),
               (long)&(iVar3._M_node[2]._M_parent)->_M_color + *(long *)(iVar3._M_node + 2));
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_188 + 0x10),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (auStack_188 + 0x30),&c->topic);
  this_00 = &this->publishers_;
  iVar4 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
          ::find(&this_00->_M_t,(key_type *)(auStack_188 + 0x10));
  if ((_Rb_tree_header *)iVar4._M_node == &(this->publishers_)._M_t._M_impl.super__Rb_tree_header) {
    createAdvertiseOptions(&local_108,c,(this->options_).queue_size,(string *)this);
    miniros::NodeHandle::advertise((AdvertiseOptions *)auStack_188);
    __pos._M_node = (this->publishers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_miniros::Publisher_&,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
                *)(auStack_188 + 0x50),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               (auStack_188 + 0x10),(Publisher *)auStack_188);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,miniros::Publisher>,std::_Select1st<std::pair<std::__cxx11::string_const,miniros::Publisher>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,miniros::Publisher>>>
    ::_M_emplace_hint_unique<std::pair<std::__cxx11::string,miniros::Publisher>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,miniros::Publisher>,std::_Select1st<std::pair<std::__cxx11::string_const,miniros::Publisher>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,miniros::Publisher>>>
                *)this_00,__pos,
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>
                *)(auStack_188 + 0x50));
    miniros::Publisher::~Publisher(&local_138.second);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138.first._M_dataplus._M_p != &local_138.first.field_2) {
      operator_delete(local_138.first._M_dataplus._M_p,
                      local_138.first.field_2._M_allocated_capacity + 1);
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_miniros::Publisher>_>_>
    ::find(&this_00->_M_t,(key_type *)(auStack_188 + 0x10));
    miniros::Publisher::~Publisher((Publisher *)auStack_188);
    miniros::AdvertiseOptions::~AdvertiseOptions(&local_108);
  }
  if ((undefined1 *)auStack_188._16_8_ != auStack_188 + 0x20) {
    operator_delete((void *)auStack_188._16_8_,auStack_188._32_8_ + 1);
  }
  if (local_158._M_dataplus._M_p != puVar2) {
    operator_delete(local_158._M_dataplus._M_p,local_158.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Player::advertise(const ConnectionInfo* c)
{
    miniros::M_string::const_iterator header_iter = c->header->find("callerid");
    std::string callerid = (header_iter != c->header->end() ? header_iter->second : string(""));

    string callerid_topic = callerid + c->topic;

    map<string, miniros::Publisher>::iterator pub_iter = publishers_.find(callerid_topic);
    if (pub_iter == publishers_.end()) {
        miniros::AdvertiseOptions opts = createAdvertiseOptions(c, options_.queue_size, options_.prefix);

        miniros::Publisher pub = node_handle_.advertise(opts);
        publishers_.insert(publishers_.begin(), pair<string, miniros::Publisher>(callerid_topic, pub));

        pub_iter = publishers_.find(callerid_topic);
    }
}